

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DeleteSegment(Fts3Table *p,Fts3SegReader *pSeg)

{
  int iVar1;
  sqlite3_stmt *in_RAX;
  sqlite3_stmt *pDelete;
  
  if (pSeg->iStartBlock != 0) {
    pDelete = in_RAX;
    iVar1 = fts3SqlStmt(p,0x11,&pDelete,(sqlite3_value **)0x0);
    if (iVar1 == 0) {
      sqlite3_bind_int64(pDelete,1,pSeg->iStartBlock);
      sqlite3_bind_int64(pDelete,2,pSeg->iEndBlock);
      sqlite3_step(pDelete);
      iVar1 = sqlite3_reset(pDelete);
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static int fts3DeleteSegment(
  Fts3Table *p,                   /* FTS table handle */
  Fts3SegReader *pSeg             /* Segment to delete */
){
  int rc = SQLITE_OK;             /* Return code */
  if( pSeg->iStartBlock ){
    sqlite3_stmt *pDelete;        /* SQL statement to delete rows */
    rc = fts3SqlStmt(p, SQL_DELETE_SEGMENTS_RANGE, &pDelete, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDelete, 1, pSeg->iStartBlock);
      sqlite3_bind_int64(pDelete, 2, pSeg->iEndBlock);
      sqlite3_step(pDelete);
      rc = sqlite3_reset(pDelete);
    }
  }
  return rc;
}